

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# promise.h
# Opt level: O0

void __thiscall Promise::Tick(Promise *this)

{
  bool bVar1;
  enable_shared_from_this<Promise> local_20;
  Promise *local_10;
  Promise *this_local;
  
  if ((this->handler_ran & 1U) == 0) {
    this->handler_ran = true;
    local_10 = this;
    bVar1 = std::function::operator_cast_to_bool((function *)&this->manually_resolved_handler);
    if (bVar1) {
      std::enable_shared_from_this<Promise>::shared_from_this(&local_20);
      std::function<void_(std::shared_ptr<Promise>)>::operator()
                (&this->manually_resolved_handler,(shared_ptr<Promise> *)&local_20);
      std::shared_ptr<Promise>::~shared_ptr((shared_ptr<Promise> *)&local_20);
    }
    else {
      bVar1 = std::function::operator_cast_to_bool((function *)&this->auto_resolved_handler);
      if (bVar1) {
        std::function<void_()>::operator()(&this->auto_resolved_handler);
        Resolve(this);
      }
      else {
        Resolve(this);
      }
    }
  }
  return;
}

Assistant:

virtual void Tick() {
    if (!handler_ran) {
      // Setting it before call to have ability to override it in handler
      handler_ran = true;

      if (manually_resolved_handler) {
        manually_resolved_handler(shared_from_this());
      } else if (auto_resolved_handler) {
        auto_resolved_handler();
        Resolve();
      } else {
        Resolve();
      }
    }
  }